

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readSecondaryTemperatures.hpp
# Opt level: O1

vector<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
* __thiscall
njoy::ENDFtk::section::Type<7,4>::
readSecondaryTemperatures<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
          (vector<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
           *__return_storage_ptr__,Type<7,4> *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT,
          stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>
          *types)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  ulong uVar5;
  double *pdVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  return_t<adaptor<true>,_std::enable_if_t<(const_iterable())_&&_CPP_true_fn(::concepts::detail::xNil__)>_>
  adapt;
  undefined4 in_stack_00000014;
  _Tuple_impl<5UL,_long> local_158;
  _Head_base<4UL,_long,_false> _Stack_150;
  _Head_base<3UL,_long,_false> local_148;
  _Head_base<2UL,_long,_false> _Stack_140;
  _Head_base<1UL,_double,_false> local_138;
  _Head_base<0UL,_double,_false> _Stack_130;
  pointer local_128;
  pointer plStack_120;
  pointer local_118;
  pointer local_110;
  pointer plStack_108;
  pointer local_100;
  pointer local_f8;
  pointer pdStack_f0;
  pointer local_e8;
  pointer local_e0;
  pointer pdStack_d8;
  pointer local_d0;
  _Storage<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature,_false> local_c8;
  char local_38;
  
  lVar4 = CONCAT44(in_stack_00000014,MT);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(lVar4 + 0x18);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = ((*(long *)(lVar4 + 8) - *(long *)(lVar4 + 0x10) >> 3) + *(ulong *)(lVar4 + 0x18))
                 - 1;
  uVar5 = SUB168(auVar3 / auVar2,0);
  (__return_storage_ptr__->
  super__Vector_base<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
  ::reserve(__return_storage_ptr__,uVar5 & 0xffffffff);
  if (SUB164(auVar3 / auVar2,0) != 0) {
    do {
      pdVar1 = *(double **)(lVar4 + 0x10);
      lVar7 = (long)(__return_storage_ptr__->
                    super__Vector_base<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(__return_storage_ptr__->
                    super__Vector_base<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
      pdVar6 = pdVar1;
      if (lVar7 != 0) {
        lVar7 = (lVar7 >> 3) * *(long *)(lVar4 + 0x18) * -0x79435e50d79435e5;
        lVar9 = (long)*(double **)(lVar4 + 8) - (long)pdVar1;
        if (lVar9 == 0) {
          lVar7 = lVar7 + *(long *)(lVar4 + 0x20);
        }
        if (lVar7 < 1) {
          pdVar6 = pdVar1 + lVar7;
        }
        else {
          pdVar6 = *(double **)(lVar4 + 8);
          if (lVar7 < lVar9 >> 3) {
            pdVar6 = pdVar1 + lVar7;
          }
        }
      }
      if ((*pdVar6 != 0.0) || (NAN(*pdVar6))) {
        local_38 = '\0';
        std::
        vector<std::optional<njoy::ENDFtk::section::Type<7,4>::EffectiveTemperature>,std::allocator<std::optional<njoy::ENDFtk::section::Type<7,4>::EffectiveTemperature>>>
        ::emplace_back<std::optional<njoy::ENDFtk::section::Type<7,4>::EffectiveTemperature>>
                  ((vector<std::optional<njoy::ENDFtk::section::Type<7,4>::EffectiveTemperature>,std::allocator<std::optional<njoy::ENDFtk::section::Type<7,4>::EffectiveTemperature>>>
                    *)__return_storage_ptr__,
                   (optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature> *)
                   &local_c8._M_value);
        if (local_38 == '\x01') {
          std::_Optional_payload_base<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>::
          _M_destroy((_Optional_payload_base<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>
                      *)&local_c8._M_value);
        }
      }
      else {
        EffectiveTemperature::
        EffectiveTemperature<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((EffectiveTemperature *)&local_158,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)this,begin,(long *)end,(int)lineNumber,MAT,MF);
        local_c8._M_value.super_TabulationRecord.super_InterpolationBase.metadata.fields.
        super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
        super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
        super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
        super__Head_base<5UL,_long,_false>._M_head_impl =
             (_Tuple_impl<5UL,_long>)
             (_Tuple_impl<5UL,_long>)local_158.super__Head_base<5UL,_long,_false>._M_head_impl;
        local_c8._M_value.super_TabulationRecord.super_InterpolationBase.metadata.fields.
        super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
        super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
        super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl =
             (_Head_base<4UL,_long,_false>)(_Head_base<4UL,_long,_false>)_Stack_150._M_head_impl;
        local_c8._M_value.super_TabulationRecord.super_InterpolationBase.metadata.fields.
        super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
        super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
        super__Head_base<3UL,_long,_false>._M_head_impl =
             (_Head_base<3UL,_long,_false>)(_Head_base<3UL,_long,_false>)local_148._M_head_impl;
        local_c8._M_value.super_TabulationRecord.super_InterpolationBase.metadata.fields.
        super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
        super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
        _M_head_impl = (_Head_base<2UL,_long,_false>)
                       (_Head_base<2UL,_long,_false>)_Stack_140._M_head_impl;
        local_c8._M_value.super_TabulationRecord.super_InterpolationBase.metadata.fields.
        super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
        _M_head_impl = (_Head_base<1UL,_double,_false>)
                       (_Head_base<1UL,_double,_false>)local_138._M_head_impl;
        local_c8._M_value.super_TabulationRecord.super_InterpolationBase.metadata.fields.
        super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
        super__Head_base<0UL,_double,_false>._M_head_impl =
             (_Head_base<0UL,_double,_false>)(_Head_base<0UL,_double,_false>)_Stack_130._M_head_impl
        ;
        local_c8._M_value.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
             local_128;
        local_c8._M_value.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
             plStack_120;
        local_c8._M_value.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = local_118;
        local_118 = (pointer)0x0;
        local_128 = (pointer)0x0;
        plStack_120 = (pointer)0x0;
        local_c8._M_value.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
             local_110;
        local_c8._M_value.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
             plStack_108;
        local_c8._M_value.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = local_100;
        local_100 = (pointer)0x0;
        local_110 = (pointer)0x0;
        plStack_108 = (pointer)0x0;
        local_c8._M_value.super_TabulationRecord.xValues.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
             = local_f8;
        local_c8._M_value.super_TabulationRecord.xValues.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = pdStack_f0;
        local_c8._M_value.super_TabulationRecord.xValues.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = local_e8;
        local_e8 = (pointer)0x0;
        local_f8 = (pointer)0x0;
        pdStack_f0 = (pointer)0x0;
        local_c8._M_value.super_TabulationRecord.yValues.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
             = local_e0;
        local_c8._M_value.super_TabulationRecord.yValues.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = pdStack_d8;
        local_c8._M_value.super_TabulationRecord.yValues.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = local_d0;
        local_d0 = (pointer)0x0;
        local_e0 = (pointer)0x0;
        pdStack_d8 = (pointer)0x0;
        local_38 = '\x01';
        std::
        vector<std::optional<njoy::ENDFtk::section::Type<7,4>::EffectiveTemperature>,std::allocator<std::optional<njoy::ENDFtk::section::Type<7,4>::EffectiveTemperature>>>
        ::emplace_back<std::optional<njoy::ENDFtk::section::Type<7,4>::EffectiveTemperature>>
                  ((vector<std::optional<njoy::ENDFtk::section::Type<7,4>::EffectiveTemperature>,std::allocator<std::optional<njoy::ENDFtk::section::Type<7,4>::EffectiveTemperature>>>
                    *)__return_storage_ptr__,
                   (optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature> *)
                   &local_c8._M_value);
        if (local_38 == '\x01') {
          std::_Optional_payload_base<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>::
          _M_destroy((_Optional_payload_base<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>
                      *)&local_c8._M_value);
        }
        if (local_e0 != (pointer)0x0) {
          operator_delete(local_e0,(long)local_d0 - (long)local_e0);
        }
        if (local_f8 != (pointer)0x0) {
          operator_delete(local_f8,(long)local_e8 - (long)local_f8);
        }
        if (local_110 != (pointer)0x0) {
          operator_delete(local_110,(long)local_100 - (long)local_110);
        }
        if (local_128 != (pointer)0x0) {
          operator_delete(local_128,(long)local_118 - (long)local_128);
        }
      }
      uVar8 = (int)uVar5 - 1;
      uVar5 = (ulong)uVar8;
    } while (uVar8 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector< std::optional< EffectiveTemperature > >
readSecondaryTemperatures( Iterator& begin,
                           const Iterator& end,
                           long& lineNumber,
                           int MAT,
                           int MF,
                           int MT,
                           const Array& types ) {
  unsigned int size = types.size();
  std::vector< std::optional< EffectiveTemperature > > sequence;
  sequence.reserve( size );

  while( size-- ){
    if ( types[ sequence.size() ] == 0 ) {
      sequence.push_back( EffectiveTemperature( begin, end, lineNumber,
                                                MAT, MF, MT ) );
    }
    else {
      sequence.push_back( std::nullopt );
    }
  }

  return sequence;
}